

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O2

FT_Error split_sdf_cubic(FT_Memory memory,FT_26D6_Vec *control_points,FT_UInt max_splits,
                        SDF_Edge **out)

{
  FT_Error FVar1;
  ulong uVar2;
  ulong uVar3;
  SDF_Edge *right;
  SDF_Edge *left;
  FT_26D6_Vec cpos [7];
  
  if (out == (SDF_Edge **)0x0) {
    return 6;
  }
  cpos[0].x = control_points->x;
  cpos[0].y = control_points->y;
  cpos[1].x = control_points[1].x;
  cpos[1].y = control_points[1].y;
  cpos[2].x = control_points[2].x;
  cpos[2].y = control_points[2].y;
  cpos[3].x = control_points[3].x;
  cpos[3].y = control_points[3].y;
  uVar3 = cpos[1].x * -3 + cpos[0].x * 2 + cpos[3].x;
  uVar2 = -uVar3;
  if (0 < (long)uVar3) {
    uVar2 = uVar3;
  }
  if (uVar2 < 0x10) {
    uVar3 = cpos[1].y * -3 + cpos[0].y * 2 + cpos[3].y;
    uVar2 = -uVar3;
    if (0 < (long)uVar3) {
      uVar2 = uVar3;
    }
    if (uVar2 < 0x10) {
      uVar3 = cpos[0].x + cpos[3].x * 2 + cpos[2].x * -3;
      uVar2 = -uVar3;
      if (0 < (long)uVar3) {
        uVar2 = uVar3;
      }
      if (uVar2 < 0x10) {
        uVar3 = cpos[0].y + cpos[3].y * 2 + cpos[2].y * -3;
        uVar2 = -uVar3;
        if (0 < (long)uVar3) {
          uVar2 = uVar3;
        }
        if (uVar2 < 0x10) {
          split_cubic(cpos);
          goto LAB_00202442;
        }
      }
    }
  }
  split_cubic(cpos);
  if (2 < max_splits) {
    FVar1 = split_sdf_cubic(memory,cpos,max_splits >> 1,out);
    if (FVar1 != 0) {
      return FVar1;
    }
    FVar1 = split_sdf_cubic(memory,cpos + 3,max_splits >> 1,out);
    return FVar1;
  }
LAB_00202442:
  FVar1 = sdf_edge_new(memory,&left);
  if ((FVar1 == 0) && (FVar1 = sdf_edge_new(memory,&right), FVar1 == 0)) {
    (left->start_pos).x = cpos[0].x;
    (left->start_pos).y = cpos[0].y;
    (left->end_pos).x = cpos[3].x;
    (left->end_pos).y = cpos[3].y;
    left->edge_type = SDF_EDGE_LINE;
    (right->start_pos).x = cpos[3].x;
    (right->start_pos).y = cpos[3].y;
    (right->end_pos).x = cpos[6].x;
    (right->end_pos).y = cpos[6].y;
    right->edge_type = SDF_EDGE_LINE;
    left->next = right;
    right->next = *out;
    *out = left;
    FVar1 = 0;
  }
  return FVar1;
}

Assistant:

static FT_Error
  split_sdf_cubic( FT_Memory     memory,
                   FT_26D6_Vec*  control_points,
                   FT_UInt       max_splits,
                   SDF_Edge**    out )
  {
    FT_Error       error = FT_Err_Ok;
    FT_26D6_Vec    cpos[7];
    SDF_Edge*      left, *right;
    const FT_26D6  threshold = ONE_PIXEL / 4;


    if ( !memory || !out )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* split the cubic */
    cpos[0] = control_points[0];
    cpos[1] = control_points[1];
    cpos[2] = control_points[2];
    cpos[3] = control_points[3];

    /* If the segment is flat enough we won't get any benefit by */
    /* splitting it further, so we can just stop splitting.      */
    /*                                                           */
    /* Check the deviation of the Bezier curve and stop if it is */
    /* smaller than the pre-defined `threshold` value.           */
    if ( FT_ABS( 2 * cpos[0].x - 3 * cpos[1].x + cpos[3].x ) < threshold &&
         FT_ABS( 2 * cpos[0].y - 3 * cpos[1].y + cpos[3].y ) < threshold &&
         FT_ABS( cpos[0].x - 3 * cpos[2].x + 2 * cpos[3].x ) < threshold &&
         FT_ABS( cpos[0].y - 3 * cpos[2].y + 2 * cpos[3].y ) < threshold )
    {
      split_cubic( cpos );
      goto Append;
    }

    split_cubic( cpos );

    /* If max number of splits is done */
    /* then stop and add the lines to  */
    /* the list.                       */
    if ( max_splits <= 2 )
      goto Append;

    /* Otherwise keep splitting. */
    FT_CALL( split_sdf_cubic( memory, &cpos[0], max_splits / 2, out ) );
    FT_CALL( split_sdf_cubic( memory, &cpos[3], max_splits / 2, out ) );

    /* [NOTE]: This is not an efficient way of   */
    /* splitting the curve.  Check the deviation */
    /* instead and stop if the deviation is less */
    /* than a pixel.                             */

    goto Exit;

  Append:
    /* Do allocation and add the lines to the list. */

    FT_CALL( sdf_edge_new( memory, &left) );
    FT_CALL( sdf_edge_new( memory, &right) );

    left->start_pos  = cpos[0];
    left->end_pos    = cpos[3];
    left->edge_type  = SDF_EDGE_LINE;

    right->start_pos = cpos[3];
    right->end_pos   = cpos[6];
    right->edge_type = SDF_EDGE_LINE;

    left->next  = right;
    right->next = (*out);
    *out        = left;

  Exit:
    return error;
  }